

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O1

bool Assimp::PLY::Element::ParseElement
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               Element *pOut)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  EElementSemantic EVar4;
  size_t sVar5;
  uint uVar6;
  char *pcVar7;
  Property prop;
  Property local_68;
  IOStreamBuffer<char> *local_38;
  
  local_38 = streamBuffer;
  if (pOut == (Element *)0x0) {
    __assert_fail("__null != pOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyParser.cpp"
                  ,0x15e,
                  "static bool Assimp::PLY::Element::ParseElement(IOStreamBuffer<char> &, std::vector<char> &, PLY::Element *)"
                 );
  }
  bVar2 = DOM::SkipSpaces(buffer);
  if ((bVar2) &&
     (((bVar2 = DOM::TokenMatch(buffer,"element",7), bVar2 ||
       (bVar2 = DOM::TokenMatch(buffer,"comment",7), bVar2)) &&
      (bVar2 = DOM::SkipSpaces(buffer), bVar2)))) {
    EVar4 = ParseSemantic(buffer);
    pOut->eSemantic = EVar4;
    if (EVar4 == EEST_INVALID) {
      pcVar7 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = strlen(pcVar7);
      local_68._0_8_ = (undefined1 *)((long)&local_68 + 0x10U);
      std::__cxx11::string::_M_construct<char*>((string *)&local_68,pcVar7,pcVar7 + sVar5);
      std::__cxx11::string::operator=((string *)&pOut->szName,(string *)&local_68);
      if ((undefined1 *)local_68._0_8_ != (undefined1 *)((long)&local_68 + 0x10U)) {
        operator_delete((void *)local_68._0_8_);
      }
    }
    bVar2 = DOM::SkipSpaces(buffer);
    if (bVar2) {
      pcVar7 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pOut->eSemantic == EEST_TextureFile) {
        sVar5 = strlen(pcVar7);
        local_68._0_8_ = (void *)((long)&local_68 + 0x10U);
        std::__cxx11::string::_M_construct<char*>((string *)&local_68,pcVar7,pcVar7 + (sVar5 - 1));
        std::__cxx11::string::operator=((string *)&pOut->szName,(string *)&local_68);
        if ((void *)local_68._0_8_ != (void *)((long)&local_68 + 0x10U)) {
          operator_delete((void *)local_68._0_8_);
        }
        DOM::SkipSpacesAndLineEnd(buffer);
      }
      else {
        cVar3 = *pcVar7;
        uVar6 = 0;
        if (0xf5 < (byte)(cVar3 - 0x3aU)) {
          uVar6 = 0;
          do {
            pcVar7 = pcVar7 + 1;
            uVar6 = (uint)(byte)(cVar3 - 0x30) + uVar6 * 10;
            cVar3 = *pcVar7;
          } while (0xf5 < (byte)(cVar3 - 0x3aU));
        }
        pOut->NumOccur = uVar6;
        DOM::SkipSpacesAndLineEnd(buffer);
        paVar1 = &local_68.szName.field_2;
        do {
          IOStreamBuffer<char>::getNextLine(local_38,buffer);
          DOM::SkipComments(buffer);
          local_68._0_8_ = &DAT_00000004;
          local_68.szName._M_string_length = 0;
          local_68.szName.field_2._M_local_buf[0] = '\0';
          local_68.bIsList = false;
          local_68.eFirstType = EDT_UChar;
          local_68.szName._M_dataplus._M_p = (pointer)paVar1;
          bVar2 = Property::ParseProperty(buffer,&local_68);
          if (bVar2) {
            std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::push_back
                      (&pOut->alProperties,&local_68);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68.szName._M_dataplus._M_p != paVar1) {
            operator_delete(local_68.szName._M_dataplus._M_p);
          }
        } while (bVar2);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool PLY::Element::ParseElement(IOStreamBuffer<char> &streamBuffer, std::vector<char> &buffer, PLY::Element* pOut)
{
  ai_assert(NULL != pOut);
  // Example format: "element vertex 8"

  // skip leading spaces
  if (!PLY::DOM::SkipSpaces(buffer))
  {
    return false;
  }

  // skip the "element" string at the beginning
  if (!PLY::DOM::TokenMatch(buffer, "element", 7) && !PLY::DOM::TokenMatch(buffer, "comment", 7))
  {
    // seems not to be a valid property entry
    return false;
  }
  // get next word
  if (!PLY::DOM::SkipSpaces(buffer))
    return false;

  // parse the semantic of the element
  pOut->eSemantic = PLY::Element::ParseSemantic(buffer);
  if (PLY::EEST_INVALID == pOut->eSemantic)
  {
    // if the exact semantic can't be determined, just store
    // the original string identifier
    pOut->szName = std::string(&buffer[0], &buffer[0] + strlen(&buffer[0]));
  }

  if (!PLY::DOM::SkipSpaces(buffer))
    return false;

  if (PLY::EEST_TextureFile == pOut->eSemantic)
  {
    char* endPos = &buffer[0] + (strlen(&buffer[0]) - 1);
    pOut->szName = std::string(&buffer[0], endPos);

    // go to the next line
    PLY::DOM::SkipSpacesAndLineEnd(buffer);

    return true;
  }

  //parse the number of occurrences of this element
  const char* pCur = (char*)&buffer[0];
  pOut->NumOccur = strtoul10(pCur, &pCur);

  // go to the next line
  PLY::DOM::SkipSpacesAndLineEnd(buffer);

  // now parse all properties of the element
  while (true)
  {
    streamBuffer.getNextLine(buffer);
    pCur = (char*)&buffer[0];

    // skip all comments
    PLY::DOM::SkipComments(buffer);

    PLY::Property prop;
    if (!PLY::Property::ParseProperty(buffer, &prop))
      break;

    pOut->alProperties.push_back(prop);
  }

  return true;
}